

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

any __thiscall
cs_impl::any::make<std::shared_ptr<std::ostream>,std::ofstream*>
          (any *this,basic_ofstream<char,_std::char_traits<char>_> **args)

{
  basic_ofstream<char,_std::char_traits<char>_> *__p;
  baseHolder *pbVar1;
  proxy *ppVar2;
  
  if ((DAT_002628c0 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x18);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<std::shared_ptr<std::istream>>::allocator + DAT_002628c0 * 8);
    DAT_002628c0 = DAT_002628c0 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_00258410;
  __p = *args;
  pbVar1[1]._vptr_baseHolder = (_func_int **)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::ofstream*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pbVar1 + 2),__p);
  if ((DAT_0025fe20 == 0) || (cs::global_thread_counter != 0)) {
    ppVar2 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar2 = (proxy *)(&cs::null_pointer)[DAT_0025fe20];
    DAT_0025fe20 = DAT_0025fe20 + -1;
  }
  ppVar2->is_rvalue = false;
  ppVar2->protect_level = 0;
  ppVar2->refcount = 1;
  ppVar2->data = pbVar1;
  this->mDat = ppVar2;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}